

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O3

void load_kde_mimelnk(char *filename,char *icondir)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  Fl_File_Icon *this;
  size_t sVar3;
  char *pcVar4;
  size_t size;
  uint *dst;
  long lVar5;
  char mimetype [1024];
  char pattern [1024];
  char iconfilename [2048];
  char tmp [1024];
  char full_iconfilename [2048];
  uint local_1c38;
  short local_1c34;
  int local_1c32;
  undefined4 uStack_1c2e;
  int local_1c2a;
  uint local_1838 [256];
  uint local_1438 [512];
  char local_c38 [1024];
  char local_838 [2056];
  
  local_1c38 = local_1c38 & 0xffffff00;
  local_1838[0]._0_1_ = '\0';
  local_1438[0]._0_1_ = '\0';
  __stream = (FILE *)fl_fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  pcVar2 = fgets(local_c38,0x400,__stream);
  if (pcVar2 != (char *)0x0) {
    do {
      pcVar2 = get_kde_val(local_c38,"Icon");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = get_kde_val(local_c38,"MimeType");
        if (pcVar2 != (char *)0x0) {
          size = 0x400;
          dst = &local_1c38;
          goto LAB_0020c39f;
        }
        pcVar2 = get_kde_val(local_c38,"Patterns");
        if (pcVar2 != (char *)0x0) {
          size = 0x400;
          dst = local_1838;
          goto LAB_0020c39f;
        }
      }
      else {
        size = 0x800;
        dst = local_1438;
LAB_0020c39f:
        fl_strlcpy((char *)dst,pcVar2,size);
      }
      pcVar2 = fgets(local_c38,0x400,__stream);
    } while (pcVar2 != (char *)0x0);
  }
  fclose(__stream);
  if (((char)local_1838[0] == '\0') && (local_1c34 != 0x2f65 || local_1c38 != 0x646f6e69)) {
    return;
  }
  if ((char)local_1438[0] == '\0') {
    return;
  }
  if ((char)local_1438[0] == '/') {
    fl_strlcpy(local_838,(char *)local_1438,0x800);
  }
  else {
    iVar1 = access(icondir,0);
    if (iVar1 == 0) {
      lVar5 = 0;
      while( true ) {
        snprintf(local_838,0x800,"%s/%s/%s.png",icondir,
                 (long)&_ZZL16load_kde_mimelnkPKcS0_E5paths_rel +
                 (long)*(int *)((long)&_ZZL16load_kde_mimelnkPKcS0_E5paths_rel + lVar5),local_1438);
        iVar1 = access(local_838,0);
        if (iVar1 == 0) break;
        lVar5 = lVar5 + 4;
        if (lVar5 == 0x28) {
          return;
        }
      }
    }
    else {
      snprintf(local_838,0x800,"%s/%s",local_c38);
      iVar1 = access(local_838,0);
      if (iVar1 != 0) {
        return;
      }
    }
  }
  if (local_1c34 != 0x2f65 || local_1c38 != 0x646f6e69) {
    this = (Fl_File_Icon *)operator_new(0x28);
    sVar3 = strlen((char *)local_1838);
    pcVar2 = (char *)malloc(sVar3 + 3);
    pcVar2[0] = '{';
    pcVar2[1] = '\0';
    strcpy(pcVar2 + 1,(char *)local_1838);
    sVar3 = strlen(pcVar2);
    if (pcVar2[sVar3 - 1] == ';') {
      pcVar2[sVar3 - 1] = '\0';
    }
    sVar3 = strlen(pcVar2);
    (pcVar2 + sVar3)[0] = '}';
    (pcVar2 + sVar3)[1] = '\0';
    pcVar4 = pcVar2;
    do {
      if (*pcVar4 == ';') {
        *pcVar4 = '|';
      }
      else if (*pcVar4 == '\0') goto LAB_0020c50e;
      pcVar4 = pcVar4 + 1;
    } while( true );
  }
  if ((short)local_1c2a == 0x79 && CONCAT44(uStack_1c2e,local_1c32) == 0x726f746365726964) {
    this = (Fl_File_Icon *)operator_new(0x28);
    Fl_File_Icon::Fl_File_Icon(this,"*",5,0,(short *)0x0);
  }
  else if (local_1c2a == 0x656369 && CONCAT44(uStack_1c2e,local_1c32) == 0x7665646b636f6c62) {
    this = (Fl_File_Icon *)operator_new(0x28);
    Fl_File_Icon::Fl_File_Icon(this,"*",3,0,(short *)0x0);
  }
  else {
    if ((char)uStack_1c2e != '\0' || local_1c32 != 0x6f666966) {
      return;
    }
    this = (Fl_File_Icon *)operator_new(0x28);
    Fl_File_Icon::Fl_File_Icon(this,"*",2,0,(short *)0x0);
  }
LAB_0020c523:
  Fl_File_Icon::load(this,local_838);
  return;
LAB_0020c50e:
  Fl_File_Icon::Fl_File_Icon(this,pcVar2,1,0,(short *)0x0);
  goto LAB_0020c523;
}

Assistant:

static void
load_kde_mimelnk(const char *filename,	// I - mimelnk filename
                 const char *icondir) {	// I - Location of icons
  FILE		*fp;
  char		tmp[1024];
  char		iconfilename[FL_PATH_MAX];
  char		pattern[1024];
  char		mimetype[1024];
  char		*val;
  char		full_iconfilename[FL_PATH_MAX];
  Fl_File_Icon	*icon;


  mimetype[0]     = '\0';
  pattern[0]      = '\0';
  iconfilename[0] = '\0';

  if ((fp = fl_fopen(filename, "rb")) != NULL) {
    while (fgets(tmp, sizeof(tmp), fp)) {
      if ((val = get_kde_val(tmp, "Icon")) != NULL)
	strlcpy(iconfilename, val, sizeof(iconfilename));
      else if ((val = get_kde_val(tmp, "MimeType")) != NULL)
	strlcpy(mimetype, val, sizeof(mimetype));
      else if ((val = get_kde_val(tmp, "Patterns")) != NULL)
	strlcpy(pattern, val, sizeof(pattern));
    }

    fclose(fp);

#ifdef DEBUG
    printf("%s: Icon=\"%s\", MimeType=\"%s\", Patterns=\"%s\"\n", filename,
           iconfilename, mimetype, pattern);
#endif // DEBUG

    if (!pattern[0] && strncmp(mimetype, "inode/", 6)) return;

    if (iconfilename[0]) {
      if (iconfilename[0] == '/') {
        strlcpy(full_iconfilename, iconfilename, sizeof(full_iconfilename));
      } else if (!access(icondir, F_OK)) {
        // KDE 3.x and 2.x icons
	int		i;		// Looping var
	static const char *paths[] = {	// Subdirs to look in...
	  "16x16/actions",
	  "16x16/apps",
	  "16x16/devices",
	  "16x16/filesystems",
	  "16x16/mimetypes",
/*
	  "20x20/actions",
	  "20x20/apps",
	  "20x20/devices",
	  "20x20/filesystems",
	  "20x20/mimetypes",

	  "22x22/actions",
	  "22x22/apps",
	  "22x22/devices",
	  "22x22/filesystems",
	  "22x22/mimetypes",

	  "24x24/actions",
	  "24x24/apps",
	  "24x24/devices",
	  "24x24/filesystems",
	  "24x24/mimetypes",
*/
	  "32x32/actions",
	  "32x32/apps",
	  "32x32/devices",
	  "32x32/filesystems",
	  "32x32/mimetypes",
/*
	  "36x36/actions",
	  "36x36/apps",
	  "36x36/devices",
	  "36x36/filesystems",
	  "36x36/mimetypes",

	  "48x48/actions",
	  "48x48/apps",
	  "48x48/devices",
	  "48x48/filesystems",
	  "48x48/mimetypes",

	  "64x64/actions",
	  "64x64/apps",
	  "64x64/devices",
	  "64x64/filesystems",
	  "64x64/mimetypes",

	  "96x96/actions",
	  "96x96/apps",
	  "96x96/devices",
	  "96x96/filesystems",
	  "96x96/mimetypes"
*/	};

        for (i = 0; i < (int)(sizeof(paths) / sizeof(paths[0])); i ++) {
          snprintf(full_iconfilename, sizeof(full_iconfilename),
	           "%s/%s/%s.png", icondir, paths[i], iconfilename);

          if (!access(full_iconfilename, F_OK)) break;
	}

        if (i >= (int)(sizeof(paths) / sizeof(paths[0]))) return;
      } else {
        // KDE 1.x icons
        snprintf(full_iconfilename, sizeof(full_iconfilename),
	         "%s/%s", tmp, iconfilename);

        if (access(full_iconfilename, F_OK)) return;
      }

      if (strncmp(mimetype, "inode/", 6) == 0) {
	if (!strcmp(mimetype + 6, "directory"))
	  icon = new Fl_File_Icon("*", Fl_File_Icon::DIRECTORY);
	else if (!strcmp(mimetype + 6, "blockdevice"))
	  icon = new Fl_File_Icon("*", Fl_File_Icon::DEVICE);
	else if (!strcmp(mimetype + 6, "fifo"))
	  icon = new Fl_File_Icon("*", Fl_File_Icon::FIFO);
	else return;
      } else {
        icon = new Fl_File_Icon(kde_to_fltk_pattern(pattern),
                                Fl_File_Icon::PLAIN);
      }

      icon->load(full_iconfilename);
    }
  }
}